

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

Expression * soul::ExpressionHelpers::createStruct(Expression *__return_storage_ptr__,Structure *s)

{
  soul *this;
  TypeDeclarationBase *t;
  string *s_00;
  string *uid;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  this = (soul *)s->backlinkToASTObject;
  if (this == (soul *)0x0) {
    s_00 = &local_60;
    std::__cxx11::string::string((string *)s_00,(string *)&s->name);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    uid = &local_a0;
    createStruct(__return_storage_ptr__,s_00,uid);
  }
  else {
    std::__cxx11::string::string((string *)&local_80,(string *)&s->name);
    uid = &local_40;
    makeUID_abi_cxx11_(uid,this,t);
    s_00 = &local_80;
    createStruct(__return_storage_ptr__,s_00,uid);
  }
  std::__cxx11::string::~string((string *)uid);
  std::__cxx11::string::~string((string *)s_00);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression createStruct (Structure& s)
    {
        if (auto structDecl = reinterpret_cast<AST::StructDeclaration*> (s.backlinkToASTObject))
            return createStruct (s.getName(), makeUID (*structDecl));

        return createStruct (s.getName(), {});
    }